

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

int __thiscall
capnp::TwoPartyServer::AcceptedConnection::init(AcceptedConnection *this,EVP_PKEY_CTX *ctx)

{
  Function<kj::String_(const_kj::Exception_&)> *extraout_RAX;
  Type local_40;
  Function<kj::String_(const_kj::Exception_&)> local_38;
  Function<kj::String_(const_kj::Exception_&)> *local_28;
  Function<kj::String_(const_kj::Exception_&)> *func;
  Function<kj::String_(const_kj::Exception_&)> *_func380;
  TwoPartyServer *parent_local;
  AcceptedConnection *this_local;
  
  _func380 = (Function<kj::String_(const_kj::Exception_&)> *)ctx;
  parent_local = (TwoPartyServer *)this;
  local_40.func =
       kj::_::readMaybe<kj::Function<kj::String(kj::Exception_const&)>>
                 ((Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_> *)(ctx + 0x18));
  if (local_40.func != (Function<kj::String_(const_kj::Exception_&)> *)0x0) {
    local_28 = local_40.func;
    func = local_40.func;
    kj::Function<kj::String(kj::Exception_const&)>::
    Function<capnp::TwoPartyServer::AcceptedConnection::init(capnp::TwoPartyServer&)::_lambda(kj::Exception_const&)_1_>
              ((Function<kj::String(kj::Exception_const&)> *)&local_38,&local_40);
    capnp::_::RpcSystemBase::setTraceEncoder(&(this->rpcSystem).super_RpcSystemBase,&local_38);
    kj::Function<kj::String_(const_kj::Exception_&)>::~Function(&local_38);
    local_40.func = extraout_RAX;
  }
  return (int)local_40.func;
}

Assistant:

void init(TwoPartyServer& parent) {
    KJ_IF_SOME(func, parent.traceEncoder) {
      rpcSystem.setTraceEncoder([&func](const kj::Exception& e) {
        return func(e);
      });
    }
  }